

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

UBool __thiscall icu_63::DecimalFormat::operator==(DecimalFormat *this,Format *other)

{
  bool bVar1;
  UBool UVar2;
  DecimalFormatProperties *this_00;
  DecimalFormatProperties *other_00;
  DecimalFormatSymbols *this_01;
  DecimalFormatSymbols *that;
  bool local_41;
  long local_40;
  DecimalFormat *otherDF;
  Format *other_local;
  DecimalFormat *this_local;
  
  if (other == (Format *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(other,&Format::typeinfo,&typeinfo,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator*
                        ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                         this->fields);
    other_00 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator*
                         (*(LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> **)
                           (local_40 + 0x168));
    bVar1 = icu_63::number::impl::DecimalFormatProperties::operator==(this_00,other_00);
    local_41 = false;
    if (bVar1) {
      this_01 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator*
                          (&(this->fields->symbols).
                            super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
      that = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator*
                       ((LocalPointerBase<const_icu_63::DecimalFormatSymbols> *)
                        (*(long *)(local_40 + 0x168) + 8));
      UVar2 = DecimalFormatSymbols::operator==(this_01,that);
      local_41 = UVar2 != '\0';
    }
    this_local._7_1_ = local_41;
  }
  return this_local._7_1_;
}

Assistant:

UBool DecimalFormat::operator==(const Format& other) const {
    auto* otherDF = dynamic_cast<const DecimalFormat*>(&other);
    if (otherDF == nullptr) {
        return false;
    }
    return *fields->properties == *otherDF->fields->properties && *fields->symbols == *otherDF->fields->symbols;
}